

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O0

uint32_t WriteBinaryLight(aiLight *l)

{
  uint32_t uVar1;
  aiLightSourceType local_1c;
  uint32_t local_18;
  uint32_t local_14;
  uint32_t old;
  uint32_t len;
  aiLight *l_local;
  
  local_14 = 0;
  _old = l;
  local_18 = WriteMagic(0x1235);
  uVar1 = Write<aiString>(&_old->mName);
  local_14 = uVar1 + local_14;
  local_1c = _old->mType;
  uVar1 = Write<unsigned_int>(&local_1c);
  local_14 = uVar1 + local_14;
  if (_old->mType != aiLightSource_DIRECTIONAL) {
    uVar1 = Write<float>(&_old->mAttenuationConstant);
    local_14 = uVar1 + local_14;
    uVar1 = Write<float>(&_old->mAttenuationLinear);
    local_14 = uVar1 + local_14;
    uVar1 = Write<float>(&_old->mAttenuationQuadratic);
    local_14 = uVar1 + local_14;
  }
  uVar1 = Write<aiColor3D>(&_old->mColorDiffuse);
  local_14 = uVar1 + local_14;
  uVar1 = Write<aiColor3D>(&_old->mColorSpecular);
  local_14 = uVar1 + local_14;
  uVar1 = Write<aiColor3D>(&_old->mColorAmbient);
  local_14 = uVar1 + local_14;
  if (_old->mType == aiLightSource_SPOT) {
    uVar1 = Write<float>(&_old->mAngleInnerCone);
    local_14 = uVar1 + local_14;
    uVar1 = Write<float>(&_old->mAngleOuterCone);
    local_14 = uVar1 + local_14;
  }
  ChangeInteger(local_18,local_14);
  return local_14;
}

Assistant:

uint32_t WriteBinaryLight(const aiLight* l)
{
	uint32_t len = 0, old = WriteMagic(ASSBIN_CHUNK_AILIGHT);

	len += Write<aiString>(l->mName);
	len += Write<unsigned int>(l->mType);

	if (l->mType != aiLightSource_DIRECTIONAL) { 
		len += Write<float>(l->mAttenuationConstant);
		len += Write<float>(l->mAttenuationLinear);
		len += Write<float>(l->mAttenuationQuadratic);
	}

	len += Write<aiColor3D>(l->mColorDiffuse);
	len += Write<aiColor3D>(l->mColorSpecular);
	len += Write<aiColor3D>(l->mColorAmbient);

	if (l->mType == aiLightSource_SPOT) {
		len += Write<float>(l->mAngleInnerCone);
		len += Write<float>(l->mAngleOuterCone);
	}

	ChangeInteger(old,len);
	return len;
}